

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void db_close_and_remove(void)

{
  fdb_status fVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar2;
  char *__format;
  long lVar3;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  timeval local_4b0;
  fdb_kvs_config local_4a0;
  fdb_doc *apfStack_488 [11];
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_4b0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_430.cleanup_cache_onclose = false;
  fdb_open(&local_4b8,"./dummy1",&local_430);
  fdb_kvs_open(local_4b8,&local_4c0,(char *)0x0,&local_4a0);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    sprintf(local_238,"key%d",uVar2 & 0xffffffff);
    sprintf(local_338,"meta%d",uVar2 & 0xffffffff);
    sprintf(local_138,"body%d",uVar2 & 0xffffffff);
    keylen = strlen(local_238);
    metalen = strlen(local_338);
    bodylen = strlen(local_138);
    fdb_doc_create((fdb_doc **)((long)apfStack_488 + lVar3),local_238,keylen,local_338,metalen,
                   local_138,bodylen);
    fdb_set(local_4c0,apfStack_488[uVar2]);
    fdb_doc_free(apfStack_488[uVar2]);
    lVar3 = lVar3 + 8;
  }
  fVar1 = fdb_commit(local_4b8,'\0');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close(local_4c0);
    fdb_close(local_4b8);
    system("rm -rf  dummy* > errorlog.txt");
    local_430.flags = 2;
    fVar1 = fdb_open(&local_4b8,"./dummy1",&local_430);
    if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (db_close_and_remove()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"db close and remove");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x500);
    db_close_and_remove()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x500,"void db_close_and_remove()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x4f3);
  db_close_and_remove()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x4f3,"void db_close_and_remove()");
}

Assistant:

void db_close_and_remove()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.cleanup_cache_onclose = false;
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // write to db
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // remove dbfile
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // re-open read-only
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("db close and remove");
}